

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
slang::ast::ASTContext::requireValidBitWidth(ASTContext *this,SVInt *value,SourceRange range)

{
  bool bVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  Diagnostic *this_00;
  long local_28;
  
  _Var2 = (_Optional_payload_base<unsigned_int>)SVInt::as<unsigned_int>(value);
  if (((ulong)_Var2 >> 0x20 & 1) == 0) {
    this_00 = addDiag(this,(DiagCode)0x60003,range);
    local_28 = 0xffffff;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<long>(&this_00->args,&local_28);
  }
  else {
    bVar1 = requireValidBitWidth(this,_Var2._M_payload._M_value,range);
    if (!bVar1) {
      _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
      _Var2._M_engaged = false;
      _Var2._5_3_ = 0;
    }
  }
  return (optional<unsigned_int>)_Var2;
}

Assistant:

std::optional<bitwidth_t> ASTContext::requireValidBitWidth(const SVInt& value,
                                                           SourceRange range) const {
    auto result = value.as<bitwidth_t>();
    if (!result)
        addDiag(diag::ValueExceedsMaxBitWidth, range) << (int)SVInt::MAX_BITS;
    else if (!requireValidBitWidth(*result, range))
        return std::nullopt;
    return result;
}